

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTupleTo<std::tuple<ot::commissioner::JoinerType,unsigned_long>,2ul>
               (tuple<ot::commissioner::JoinerType,_unsigned_long> *t,ostream *param_2)

{
  __tuple_element_t<1UL,_tuple<JoinerType,_unsigned_long>_> *value;
  ostream *os_local;
  tuple<ot::commissioner::JoinerType,_unsigned_long> *t_local;
  
  PrintTupleTo<std::tuple<ot::commissioner::JoinerType,unsigned_long>,1ul>(t,param_2);
  std::operator<<(param_2,", ");
  value = std::get<1ul,ot::commissioner::JoinerType,unsigned_long>(t);
  UniversalPrinter<unsigned_long>::Print(value,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}